

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkys(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  char *in_RCX;
  int *in_R8;
  bool bVar3;
  int keypos;
  int len;
  char nextcomm [73];
  char card [81];
  char oldcomm [73];
  char valstring [71];
  char oldval [71];
  int local_1cc;
  char in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe39;
  char *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fitsfile *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  fitsfile *in_stack_fffffffffffffeb0;
  int *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff39;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int local_4;
  
  if (*in_R8 < 1) {
    iVar1 = ffgkey(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (iVar1 < 1) {
      ffs2c(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      if ((in_RCX == (char *)0x0) || (*in_RCX == '&')) {
        ffmkky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (char *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      else {
        ffmkky(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (char *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      ffmkey(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      if (*in_R8 < 1) {
        ffpmrk();
        ffc2s((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
              (int *)CONCAT71(in_stack_fffffffffffffe39,in_stack_fffffffffffffe38));
        if (*in_R8 == 0xcc) {
          ffcmrk();
          *in_R8 = 0;
        }
        else {
          sVar2 = strlen(&stack0xffffffffffffff38);
          local_1cc = (int)sVar2;
          while( true ) {
            bVar3 = false;
            if (local_1cc != 0) {
              bVar3 = (&stack0xffffffffffffff38)[local_1cc + -1] == '&';
            }
            if (!bVar3) break;
            ffgcnt(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed0);
            if ((in_stack_ffffffffffffff38 == '\0') &&
               (sVar2 = strlen(&stack0xfffffffffffffe38), sVar2 == 0)) {
              local_1cc = 0;
            }
            else {
              ffdrec(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
              sVar2 = strlen(&stack0xffffffffffffff38);
              local_1cc = (int)sVar2;
            }
          }
        }
        local_4 = *in_R8;
      }
      else {
        local_4 = *in_R8;
      }
    }
    else {
      local_4 = *in_R8;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffmkys(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           const char *value,       /* I - keyword value      */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
  /* NOTE: This routine does not support long continued strings */
  /*  It will correctly overwrite an existing long continued string, */
  /*  but it will not write a new long string.  */

    char oldval[FLEN_VALUE], valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD], nextcomm[FLEN_COMMENT];
    int len, keypos;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, oldval, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffs2c(value, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status); /* overwrite the previous keyword */

    keypos = (int) (((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1);

    if (*status > 0)           
        return(*status);

    /* check if old string value was continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(oldval, valstring, status); /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
        
      len = strlen(valstring);

      while (len && valstring[len - 1] == '&')  /* ampersand is continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, valstring, nextcomm, status);
        if (*valstring || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the continuation */
            len = strlen(valstring);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}